

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::FillSystemEnvironmentPath(cmFindBase *this)

{
  cmSearchPath *pcVar1;
  ulong uVar2;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  cmSearchPath *local_18;
  cmSearchPath *paths;
  cmFindBase *this_local;
  
  paths = (cmSearchPath *)this;
  local_18 = std::
             map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
             ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                          &cmFindCommon::PathLabel::SystemEnvironment);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmSearchPath::AddEnvPath(local_18,&this->EnvironmentPath);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"PATH",&local_39);
    cmSearchPath::AddEnvPrefixPath(pcVar1,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"PATH",&local_71);
  cmSearchPath::AddEnvPath(pcVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  cmSearchPath::AddSuffixes(local_18,&(this->super_cmFindCommon).SearchPathSuffixes);
  return;
}

Assistant:

void cmFindBase::FillSystemEnvironmentPath()
{
  cmSearchPath &paths = this->LabeledPaths[PathLabel::SystemEnvironment];

  // Add LIB or INCLUDE
  if(!this->EnvironmentPath.empty())
    {
    paths.AddEnvPath(this->EnvironmentPath);
    paths.AddEnvPrefixPath("PATH", true);
    }
  // Add PATH
  paths.AddEnvPath("PATH");
  paths.AddSuffixes(this->SearchPathSuffixes);
}